

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O2

void __thiscall bsplib::Rdma::PushPopCommBuf::serialize(PushPopCommBuf *this,A2A *a2a)

{
  pointer pPVar1;
  unsigned_long x;
  unsigned_long x_00;
  pointer puVar2;
  ssize_t sVar3;
  size_t in_RDX;
  size_t extraout_RDX;
  size_t __n;
  size_t s;
  ulong uVar4;
  int iVar5;
  int in_R8D;
  int p;
  long lVar6;
  Buffer nbuf;
  undefined1 local_52 [10];
  long local_48;
  size_t local_40;
  ulong local_38;
  
  local_48 = (long)(this->m_popped_slots).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_popped_slots).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
  sVar3 = UIntSerialize<unsigned_long>::write
                    ((int)((long)(this->m_pushed_slots).
                                 super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_pushed_slots).
                                 super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5),local_52,in_RDX);
  local_40 = (size_t)(int)sVar3;
  iVar5 = 0;
  __n = extraout_RDX;
  while( true ) {
    if (a2a->m_nprocs <= iVar5) break;
    A2A::send(a2a,iVar5,local_52,local_40,in_R8D);
    lVar6 = 0;
    __n = 0;
    while (pPVar1 = (this->m_pushed_slots).
                    super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          __n < (ulong)((long)(this->m_pushed_slots).
                              super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 5)) {
      x = *(unsigned_long *)((long)&(pPVar1->block).size + lVar6);
      x_00 = *(unsigned_long *)((long)&pPVar1->slot + lVar6);
      local_38 = __n;
      serial<unsigned_long>(a2a,iVar5,*(unsigned_long *)((long)&(pPVar1->block).addr + lVar6));
      serial<unsigned_long>(a2a,iVar5,x);
      serial<unsigned_long>(a2a,iVar5,x_00);
      lVar6 = lVar6 + 0x20;
      __n = local_38 + 1;
    }
    iVar5 = iVar5 + 1;
  }
  sVar3 = UIntSerialize<unsigned_long>::write((int)(local_48 >> 3),local_52,__n);
  for (iVar5 = 0; iVar5 < a2a->m_nprocs; iVar5 = iVar5 + 1) {
    A2A::send(a2a,iVar5,local_52,(long)(int)sVar3,in_R8D);
    for (uVar4 = 0;
        puVar2 = (this->m_popped_slots).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)(this->m_popped_slots).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3);
        uVar4 = uVar4 + 1) {
      serial<unsigned_long>(a2a,iVar5,puVar2[uVar4]);
    }
  }
  return;
}

Assistant:

void Rdma::PushPopCommBuf::serialize( A2A & a2a ) 
{
    typedef UIntSerialize< size_t >    SizeSer;

    const size_t n_pushed_slots = m_pushed_slots.size();
    const size_t n_popped_slots = m_popped_slots.size();

    // broadcast pushed slots
    { SizeSer::Buffer nbuf;
      const int n_nbuf = SizeSer::write( n_pushed_slots, nbuf );
      for (int p = 0; p < a2a.nprocs(); ++p) {
        a2a.send( p, nbuf, n_nbuf );

        for (size_t s = 0; s < m_pushed_slots.size(); ++s) {
            PushEntry entry = m_pushed_slots[s];
            char * null = NULL;
            size_t addr = static_cast<char *>(entry.block.addr) - null;
            size_t size = entry.block.size;
            size_t id = entry.slot;
            
            serial( a2a, p, addr );
            serial( a2a, p, size );
            serial( a2a, p, id );
        }
    } }

    // broadcast popped slots
    { SizeSer::Buffer nbuf;
      const int n_nbuf = SizeSer::write( n_popped_slots, nbuf );
      for (int p = 0; p < a2a.nprocs(); ++p) {
        a2a.send( p, nbuf, n_nbuf );

        for (size_t s = 0; s < m_popped_slots.size(); ++s) {
            Memslot slotid = m_popped_slots[s];
            serial( a2a, p, slotid );
        }
    } }
}